

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_rr_move(archive_write *a)

{
  isoent *local_60;
  isoent *newent;
  isoent *mvent;
  isoent *piStack_48;
  int r;
  isoent *last;
  isoent *np;
  isoent *rr_moved;
  isoent *rootent;
  path_table *pt;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pt = (path_table *)a->format_data;
  rootent = (isoent *)(pt[6].last + 0x1c);
  if (*(int *)(pt[6].last + 0x1f) != 0) {
    rr_moved = *(isoent **)&pt[5].cnt;
    iso9660 = (iso9660_conflict *)a;
    np = isoent_find_child(rr_moved,"rr_moved");
    if ((np != (isoent *)0x0) && (np != (rr_moved->children).first)) {
      isoent_remove_child(rr_moved,np);
      isoent_add_child_head(rr_moved,np);
    }
    last = (isoent *)(rootent->rbnode).rb_nodes[0];
    while (last != (isoent *)0x0) {
      piStack_48 = path_table_last_entry((path_table *)rootent);
      for (; last != (isoent *)0x0; last = last->ptnext) {
        if ((char)(last->field_0xe8 << 6) < '\0') {
          for (newent = (last->subdirs).first; newent != (isoent *)0x0; newent = newent->drnext) {
            mvent._4_4_ = isoent_rr_move_dir((archive_write *)iso9660,&np,newent,&local_60);
            if (mvent._4_4_ < 0) {
              return mvent._4_4_;
            }
            isoent_collect_dirs((vdd *)&pt[5].cnt,local_60,2);
          }
        }
      }
      last = piStack_48->ptnext;
    }
  }
  return 0;
}

Assistant:

static int
isoent_rr_move(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct path_table *pt;
	struct isoent *rootent, *rr_moved;
	struct isoent *np, *last;
	int r;

	pt = &(iso9660->primary.pathtbl[MAX_DEPTH-1]);
	/* Theare aren't level 8 directories reaching a deepr level. */
	if (pt->cnt == 0)
		return (ARCHIVE_OK);

	rootent = iso9660->primary.rootent;
	/* If "rr_moved" directory is already existing,
	 * we have to use it. */
	rr_moved = isoent_find_child(rootent, "rr_moved");
	if (rr_moved != NULL &&
	    rr_moved != rootent->children.first) {
		/*
		 * It's necessary that rr_move is the first entry
		 * of the root.
		 */
		/* Remove "rr_moved" entry from children chain. */
		isoent_remove_child(rootent, rr_moved);

		/* Add "rr_moved" entry into the head of children chain. */
		isoent_add_child_head(rootent, rr_moved);
	}

	/*
	 * Check level 8 path_table.
	 * If find out sub directory entries, that entries move to rr_move.
	 */
	np = pt->first;
	while (np != NULL) {
		last = path_table_last_entry(pt);
		for (; np != NULL; np = np->ptnext) {
			struct isoent *mvent;
			struct isoent *newent;

			if (!np->dir)
				continue;
			for (mvent = np->subdirs.first;
			    mvent != NULL; mvent = mvent->drnext) {
				r = isoent_rr_move_dir(a, &rr_moved,
				    mvent, &newent);
				if (r < 0)
					return (r);
				isoent_collect_dirs(&(iso9660->primary),
				    newent, 2);
			}
		}
		/* If new entries are added to level 8 path_talbe,
		 * its sub directory entries move to rr_move too.
		 */
		np = last->ptnext;
	}

	return (ARCHIVE_OK);
}